

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testinplacetext.cpp
# Opt level: O0

void Am_Inplace_Move_Prev(Am_Object *text)

{
  byte bVar1;
  Am_Value *this;
  void *value_00;
  Am_Value *pAVar2;
  ushort uVar3;
  Am_Object local_40 [3];
  byte local_21;
  bool success;
  Am_String value;
  Am_Text_Navigate *text_nav;
  Am_Object *text_local;
  
  uVar3 = (ushort)text;
  this = (Am_Value *)Am_Object::Get(uVar3,(ulong)Am_INPLACE_TEXT_NAV);
  value_00 = Am_Value::operator_cast_to_void_(this);
  value.data = (Am_String_Data *)Am_Text_Navigate::Narrow(value_00);
  if (value.data != (Am_String_Data *)0x0) {
    pAVar2 = (Am_Value *)Am_Object::Get(uVar3,0xab);
    Am_String::Am_String((Am_String *)&stack0xffffffffffffffe0,pAVar2);
    bVar1 = Am_String::operator==((Am_String *)&stack0xffffffffffffffe0,"");
    if ((bVar1 & 1) == 0) {
      local_21 = (*(code *)**(undefined8 **)value.data)(value.data,4);
    }
    else {
      local_21 = (**(code **)(*(long *)value.data + 0x10))(value.data,4);
    }
    local_21 = local_21 & 1;
    Am_Object::Note_Changed(uVar3);
    if ((local_21 & 1) != 0) {
      Am_Object::Am_Object(local_40,(Am_Object *)text);
      Am_Move_Cursor_To_End((Am_Object *)local_40);
      Am_Object::~Am_Object(local_40);
    }
    Am_String::~Am_String((Am_String *)&stack0xffffffffffffffe0);
  }
  return;
}

Assistant:

static void
Am_Inplace_Move_Prev(Am_Object text)
{
  Am_Text_Navigate *text_nav =
      Am_Text_Navigate::Narrow((Am_Ptr)text.Get(Am_INPLACE_TEXT_NAV));
  if (text_nav) {
    Am_String value = text.Get(Am_TEXT);
    bool success;
    if (value == "")
      success = text_nav->Delete(Am_INPLACE_PREV);
    else
      success = text_nav->Move(Am_INPLACE_PREV);
    text.Note_Changed(Am_INPLACE_TEXT_INFO);
    if (success)
      Am_Move_Cursor_To_End(text);
  }
}